

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments.cpp
# Opt level: O2

void __thiscall r_comp::Image::build_references(Image *this)

{
  uint uVar1;
  uint uVar2;
  SysObject *sys_object;
  SysObject **ppSVar3;
  uint *puVar4;
  ulong i;
  
  i = 0;
  while( true ) {
    if ((ulong)((long)(this->code_segment).objects.m_vector.
                      super__Vector_base<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->code_segment).objects.m_vector.
                      super__Vector_base<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) <= i) {
      return;
    }
    ppSVar3 = r_code::vector<r_code::SysObject_*>::operator[](&(this->code_segment).objects,i);
    sys_object = *ppSVar3;
    if ((ulong)(*(long *)(sys_object + 0x28) - *(long *)(sys_object + 0x20)) < 5) break;
    puVar4 = r_code::vector<unsigned_int>::operator[]((vector<unsigned_int> *)(sys_object + 0x20),0)
    ;
    uVar1 = *puVar4;
    puVar4 = r_code::vector<unsigned_int>::operator[]((vector<unsigned_int> *)(sys_object + 0x20),1)
    ;
    uVar2 = *puVar4;
    if (*(long *)(sys_object + 0x28) != *(long *)(sys_object + 0x20)) {
      *(long *)(sys_object + 0x28) = *(long *)(sys_object + 0x20);
    }
    build_references(this,sys_object,(Code *)CONCAT44(uVar2,uVar1));
    i = i + 1;
  }
  __assert_fail("sys_object->references.size() >= 2",
                "/workspace/llm4binary/github/license_c_cmakelists/sandsmark[P]replicode/r_comp/segments.cpp"
                ,0x25a,"void r_comp::Image::build_references()");
}

Assistant:

void Image::build_references()
{
    Code *object;
    SysObject *sys_object;

    for (size_t i = 0; i < code_segment.objects.size(); ++i) {
        sys_object = code_segment.objects[i];
        assert(sys_object->references.size() >= 2);
        uintptr_t _object = sys_object->references[0];
        _object |= (uintptr_t(sys_object->references[1]) << 32);
        object = (Code *)_object;
        sys_object->references.as_std()->clear();
        build_references(sys_object, object);
    }
}